

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

int socket_close(Curl_easy *data,connectdata *conn,int use_callback,curl_socket_t sock)

{
  int rc;
  curl_socket_t sock_local;
  int use_callback_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (sock == -1) {
    data_local._4_4_ = 0;
  }
  else if (((use_callback == 0) || (conn == (connectdata *)0x0)) ||
          (conn->fclosesocket == (curl_closesocket_callback)0x0)) {
    if (conn != (connectdata *)0x0) {
      Curl_multi_closed(data,sock);
    }
    close(sock);
    data_local._4_4_ = 0;
  }
  else {
    Curl_multi_closed(data,sock);
    Curl_set_in_callback(data,true);
    data_local._4_4_ = (*conn->fclosesocket)(conn->closesocket_client,sock);
    Curl_set_in_callback(data,false);
  }
  return data_local._4_4_;
}

Assistant:

static int socket_close(struct Curl_easy *data, struct connectdata *conn,
                        int use_callback, curl_socket_t sock)
{
  if(CURL_SOCKET_BAD == sock)
    return 0;

  if(use_callback && conn && conn->fclosesocket) {
    int rc;
    Curl_multi_closed(data, sock);
    Curl_set_in_callback(data, true);
    rc = conn->fclosesocket(conn->closesocket_client, sock);
    Curl_set_in_callback(data, false);
    return rc;
  }

  if(conn)
    /* tell the multi-socket code about this */
    Curl_multi_closed(data, sock);

  sclose(sock);

  return 0;
}